

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.h
# Opt level: O1

double llvm::scalbn(double __x,int __n)

{
  IEEEFloat *rhs;
  fltSemantics *Semantics;
  long in_RSI;
  undefined4 in_register_0000003c;
  double __x_00;
  double extraout_XMM0_Qa;
  double __x_01;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double dVar1;
  undefined1 auStack_98 [8];
  unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_> local_90;
  undefined1 local_88 [8];
  _Head_base<0UL,_llvm::APFloat_*,_false> local_80;
  IEEEFloat local_78;
  IEEEFloat local_60;
  IEEEFloat local_48;
  
  rhs = (IEEEFloat *)(in_RSI + 8);
  if (*(undefined1 **)(in_RSI + 8) == semPPCDoubleDouble) {
    detail::DoubleAPFloat::DoubleAPFloat((DoubleAPFloat *)auStack_98,(DoubleAPFloat *)rhs);
    detail::scalbn(__x_01,(int)(DoubleAPFloat *)local_88);
    APFloat::APFloat((APFloat *)CONCAT44(in_register_0000003c,__n),(DoubleAPFloat *)local_88,
                     rhs->semantics);
    dVar1 = extraout_XMM0_Qa_00;
    if ((_Head_base<0UL,_llvm::APFloat_*,_false>)local_80._M_head_impl !=
        (_Head_base<0UL,_llvm::APFloat_*,_false>)0x0) {
      std::default_delete<llvm::APFloat[]>::operator()
                ((default_delete<llvm::APFloat[]> *)&local_80,local_80._M_head_impl);
      dVar1 = extraout_XMM0_Qa_01;
    }
    local_80._M_head_impl = (APFloat *)0x0;
    if (local_90._M_t.super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>.
        _M_t.super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
        super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>)0x0) {
      std::default_delete<llvm::APFloat[]>::operator()
                ((default_delete<llvm::APFloat[]> *)&local_90,
                 (APFloat *)
                 local_90._M_t.
                 super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
                 super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                 super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl);
      dVar1 = extraout_XMM0_Qa_02;
    }
  }
  else {
    detail::IEEEFloat::IEEEFloat(&local_78,rhs);
    detail::scalbn(__x_00,(int)&local_60);
    Semantics = rhs->semantics;
    detail::IEEEFloat::IEEEFloat(&local_48,&local_60);
    APFloat::Storage::Storage
              ((Storage *)&(((APFloat *)CONCAT44(in_register_0000003c,__n))->U).IEEE,&local_48,
               Semantics);
    detail::IEEEFloat::~IEEEFloat(&local_48);
    detail::IEEEFloat::~IEEEFloat(&local_60);
    detail::IEEEFloat::~IEEEFloat(&local_78);
    dVar1 = extraout_XMM0_Qa;
  }
  return dVar1;
}

Assistant:

inline APFloat scalbn(APFloat X, int Exp, APFloat::roundingMode RM) {
  if (APFloat::usesLayout<detail::IEEEFloat>(X.getSemantics()))
    return APFloat(scalbn(X.U.IEEE, Exp, RM), X.getSemantics());
  if (APFloat::usesLayout<detail::DoubleAPFloat>(X.getSemantics()))
    return APFloat(scalbn(X.U.Double, Exp, RM), X.getSemantics());
  llvm_unreachable("Unexpected semantics");
}